

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O3

int scroll_indicator_size_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  Am_Object scroll_bar;
  Am_Widget_Look look;
  Am_Object local_20;
  Am_Widget_Look local_14;
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_20);
  iVar4 = 10;
  if (bVar1) {
    pAVar3 = Am_Object::Get(&local_20,0x17f,0);
    local_14.value = Am_MOTIF_LOOK_val;
    if ((pAVar3->type != 1) && (pAVar3->type != Am_Widget_Look::Am_Widget_Look_ID)) {
      Am_Widget_Look::TypeError(&local_14,pAVar3);
    }
    local_14.value = (Am_Widget_Look_vals)(pAVar3->value).float_value;
    iVar4 = 0x10;
    if (Am_MACINTOSH_LOOK.value != local_14.value) {
      pAVar3 = Am_Object::Get(&local_20,0x1b4,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      pAVar3 = Am_Object::Get(&local_20,0x185,0);
      fVar5 = Am_Value::operator_cast_to_float(pAVar3);
      fVar6 = 1.0;
      if (fVar5 <= 1.0) {
        fVar6 = fVar5;
      }
      iVar4 = 6;
      if (6 < (int)((float)iVar2 * fVar6)) {
        iVar4 = (int)((float)iVar2 * fVar6);
      }
    }
  }
  Am_Object::~Am_Object(&local_20);
  return iVar4;
}

Assistant:

Am_Define_Formula(int, scroll_indicator_size)
{
  Am_Object scroll_bar = self.Get_Owner();
  if (!scroll_bar.Valid())
    return 10;
  Am_Widget_Look look = scroll_bar.Get(Am_WIDGET_LOOK);

  int size = 0;
  if (look == Am_MACINTOSH_LOOK)
    size = 16;
  else {
    int maxsize = scroll_bar.Get(Am_SCROLL_AREA_SIZE);
    float percent = scroll_bar.Get(Am_PERCENT_VISIBLE);
    if (percent > 1.0f)
      percent = 1.0f;
    size = (int)(maxsize * percent);
    if (size < 6)
      size = 6;
  }
  return size;
}